

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O0

bool jsonip::parser::semantic_rule<jsonip::grammar::array_start,jsonip::parser::char_<(char)91>>::
     match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
               (ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state)

{
  fpos<__mbstate_t> local_58 [16];
  streamoff local_48;
  pair<std::fpos<__mbstate_t>,_long> local_40;
  byte local_21;
  fpos<__mbstate_t> afStack_20 [7];
  bool result;
  PositionType p;
  ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader> *state_local;
  
  _afStack_20 = ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::pos(state);
  local_21 = char_<(char)91>::
             match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>>
                       (state);
  if ((bool)local_21) {
    local_58 = (fpos<__mbstate_t>  [16])
               ReaderState<jsonip::semantic_state,_jsonip::parser::IStreamReader>::pos(state);
    local_48 = std::fpos<__mbstate_t>::operator-(local_58,afStack_20);
    std::make_pair<std::fpos<__mbstate_t>&,long>(&local_40,afStack_20,&local_48);
    grammar::array_start::
    process_match<jsonip::parser::ReaderState<jsonip::semantic_state,jsonip::parser::IStreamReader>,std::pair<std::fpos<__mbstate_t>,long>>
              (state,&local_40);
  }
  return (bool)(local_21 & 1);
}

Assistant:

static inline bool match(S& state)
        {
            typename S::PositionType p = state.pos();

            // Try the rule itself
            bool result;
            if (true == (result = C0::match(state)))
                A::process_match(state, std::make_pair(p, state.pos() - p));

            return result;
        }